

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O1

int cpio_getopt(cpio *cpio)

{
  char cVar1;
  char **ppcVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  size_t __n;
  char *pcVar7;
  option *poVar8;
  option *poVar9;
  char *pcVar10;
  option *poVar11;
  uint __c;
  option *poVar12;
  
  pcVar10 = "--";
  while( true ) {
    cpio->argument = (char *)0x0;
    if (cpio_getopt::state == 0) {
      cpio->argv = cpio->argv + 1;
      cpio->argc = cpio->argc + -1;
      cpio_getopt::state = 1;
    }
    if (cpio_getopt::state == 1) {
      ppcVar2 = cpio->argv;
      pcVar7 = *ppcVar2;
      if (pcVar7 == (char *)0x0) {
        return -1;
      }
      if (*pcVar7 != '-') {
        return -1;
      }
      iVar3 = strcmp(pcVar7,"--");
      cpio->argv = ppcVar2 + 1;
      if (iVar3 == 0) {
        cpio->argc = cpio->argc + -1;
        return -1;
      }
      pcVar7 = *ppcVar2;
      cpio->argc = cpio->argc + -1;
      if (pcVar7[1] == '-') {
        cpio_getopt::state = 3;
        cpio_getopt::opt_word = pcVar7 + 2;
      }
      else {
        cpio_getopt::opt_word = pcVar7 + 1;
        cpio_getopt::state = 2;
      }
    }
    if (cpio_getopt::state != 2) {
      __c = 0x3f;
      goto LAB_0010dfa3;
    }
    pcVar7 = cpio_getopt::opt_word + 1;
    cVar1 = *cpio_getopt::opt_word;
    __c = (uint)cVar1;
    cpio_getopt::opt_word = pcVar7;
    if (cVar1 != '\0') break;
    cpio_getopt::state = 1;
  }
  pvVar4 = memchr("0AaBC:cdE:F:f:H:hI:iJjLlmnO:opR:rtuVvW:yZz",__c,0x2b);
  if (pvVar4 == (void *)0x0) {
    return 0x3f;
  }
  if (*(char *)((long)pvVar4 + 1) == ':') {
    if (*pcVar7 == '\0') {
      cpio_getopt::opt_word = *cpio->argv;
      if (cpio_getopt::opt_word == (char *)0x0) {
        lafe_warnc(0,"Option -%c requires an argument",(ulong)__c);
        return 0x3f;
      }
      cpio->argv = cpio->argv + 1;
      cpio->argc = cpio->argc + -1;
    }
    if (cVar1 == 'W') {
      cpio_getopt::state = 3;
      __c = 0x57;
      pcVar10 = "-W ";
    }
    else {
      cpio_getopt::state = 1;
      cpio->argument = cpio_getopt::opt_word;
    }
  }
LAB_0010dfa3:
  pcVar7 = cpio_getopt::opt_word;
  if (cpio_getopt::state != 3) {
    return __c;
  }
  cpio_getopt::state = 1;
  pcVar5 = strchr(cpio_getopt::opt_word,0x3d);
  if (pcVar5 == (char *)0x0) {
    __n = strlen(pcVar7);
  }
  else {
    __n = (long)pcVar5 - (long)pcVar7;
    cpio->argument = pcVar5 + 1;
  }
  cVar1 = *pcVar7;
  poVar8 = cpio_longopts;
  pcVar5 = "b64encode";
  poVar11 = (option *)0x0;
  poVar12 = (option *)0x0;
  do {
    poVar9 = poVar12;
    if (((*pcVar5 == cVar1) && (iVar3 = strncmp(pcVar7,pcVar5,__n), iVar3 == 0)) &&
       (sVar6 = strlen(pcVar5), poVar9 = poVar8, poVar11 = poVar12, sVar6 == __n)) {
      poVar11 = (option *)0x0;
      break;
    }
    pcVar5 = poVar8[1].name;
    poVar8 = poVar8 + 1;
    poVar12 = poVar9;
  } while (pcVar5 != (char *)0x0);
  if (poVar9 != (option *)0x0) {
    if (poVar11 != (option *)0x0) {
      lafe_warnc(0,"Ambiguous option %s%s (matches --%s and --%s)",pcVar10,pcVar7,poVar9->name,
                 poVar11->name);
      return 0x3f;
    }
    if (poVar9->required == 0) {
      if (cpio->argument != (char *)0x0) {
        pcVar7 = poVar9->name;
        pcVar5 = "Option %s%s does not allow an argument";
        goto LAB_0010e0ac;
      }
    }
    else if (cpio->argument == (char *)0x0) {
      pcVar7 = *cpio->argv;
      cpio->argument = pcVar7;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = poVar9->name;
        pcVar5 = "Option %s%s requires an argument";
        goto LAB_0010e0ac;
      }
      cpio->argv = cpio->argv + 1;
      cpio->argc = cpio->argc + -1;
    }
    return poVar9->equivalent;
  }
  pcVar5 = "Option %s%s is not supported";
LAB_0010e0ac:
  lafe_warnc(0,pcVar5,pcVar10,pcVar7);
  return 0x3f;
}

Assistant:

int
cpio_getopt(struct cpio *cpio)
{
	enum { state_start = 0, state_next_word, state_short, state_long };
	static int state = state_start;
	static char *opt_word;

	const struct option *popt, *match = NULL, *match2 = NULL;
	const char *p, *long_prefix = "--";
	size_t optlength;
	int opt = '?';
	int required = 0;

	cpio->argument = NULL;

	/* First time through, initialize everything. */
	if (state == state_start) {
		/* Skip program name. */
		++cpio->argv;
		--cpio->argc;
		state = state_next_word;
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (state == state_next_word) {
		/* No more arguments, so no more options. */
		if (cpio->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (cpio->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(cpio->argv[0], "--") == 0) {
			++cpio->argv;
			--cpio->argc;
			return (-1);
		}
		/* Get next word for parsing. */
		opt_word = *cpio->argv++;
		--cpio->argc;
		if (opt_word[1] == '-') {
			/* Set up long option parser. */
			state = state_long;
			opt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			state = state_short;
			++opt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *opt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			state = state_next_word;
			return cpio_getopt(cpio);
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, opt_word already points to it. */
			if (opt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				opt_word = *cpio->argv;
				if (opt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++cpio->argv;
				--cpio->argc;
			}
			if (opt == 'W') {
				state = state_long;
				long_prefix = "-W "; /* For clearer errors. */
			} else {
				state = state_next_word;
				cpio->argument = opt_word;
			}
		}
	}

	/* We're reading a long option, including -W long=arg convention. */
	if (state == state_long) {
		/* After this long option, we'll be starting a new word. */
		state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(opt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - opt_word);
			cpio->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(opt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = cpio_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != opt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(opt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, opt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, opt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (cpio->argument == NULL) {
				cpio->argument = *cpio->argv;
				if (cpio->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++cpio->argv;
				--cpio->argc;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (cpio->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}